

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O2

SoapySDRArgInfo * toArgInfo(SoapySDRArgInfo *__return_storage_ptr__,ArgInfo *info)

{
  double dVar1;
  double dVar2;
  char *pcVar3;
  char **ppcVar4;
  size_t sStack_18;
  
  __return_storage_ptr__->options = (char **)0x0;
  __return_storage_ptr__->optionNames = (char **)0x0;
  (__return_storage_ptr__->range).step = 0.0;
  __return_storage_ptr__->numOptions = 0;
  (__return_storage_ptr__->range).minimum = 0.0;
  (__return_storage_ptr__->range).maximum = 0.0;
  __return_storage_ptr__->units = (char *)0x0;
  *(undefined8 *)&__return_storage_ptr__->type = 0;
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->description = (char *)0x0;
  __return_storage_ptr__->key = (char *)0x0;
  __return_storage_ptr__->value = (char *)0x0;
  pcVar3 = toCString(&info->key);
  __return_storage_ptr__->key = pcVar3;
  pcVar3 = toCString(&info->value);
  __return_storage_ptr__->value = pcVar3;
  pcVar3 = toCString(&info->name);
  __return_storage_ptr__->name = pcVar3;
  pcVar3 = toCString(&info->description);
  __return_storage_ptr__->description = pcVar3;
  pcVar3 = toCString(&info->units);
  __return_storage_ptr__->units = pcVar3;
  __return_storage_ptr__->type = info->type;
  dVar1 = (info->range)._step;
  dVar2 = (info->range)._max;
  (__return_storage_ptr__->range).minimum = (info->range)._min;
  (__return_storage_ptr__->range).maximum = dVar2;
  (__return_storage_ptr__->range).step = dVar1;
  ppcVar4 = toStrArray(&info->options,&__return_storage_ptr__->numOptions,0);
  __return_storage_ptr__->options = ppcVar4;
  ppcVar4 = toStrArray(&info->optionNames,&sStack_18,__return_storage_ptr__->numOptions);
  __return_storage_ptr__->optionNames = ppcVar4;
  return __return_storage_ptr__;
}

Assistant:

static inline SoapySDRArgInfo toArgInfo(const SoapySDR::ArgInfo &info)
{
    SoapySDRArgInfo out;
    std::memset(&out, 0, sizeof(out));
    try
    {
        out.key = toCString(info.key);
        out.value = toCString(info.value);
        out.name = toCString(info.name);
        out.description = toCString(info.description);
        out.units = toCString(info.units);
        out.type = SoapySDRArgInfoType(info.type);
        out.range = toRange(info.range);
        out.options = toStrArray(info.options, &out.numOptions);
        size_t namesLength = 0;
        // will be calloc-ed to be at least as long as options to prevent clients from reading garbage
        out.optionNames = toStrArray(info.optionNames, &namesLength, out.numOptions);
    }
    catch (const std::bad_alloc &)
    {
        SoapySDRArgInfo_clear(&out);
        throw;
    }

    return out;
}